

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

aom_noise_status_t
aom_noise_model_update
          (aom_noise_model_t *noise_model,uint8_t **data,uint8_t **denoised,int w,int h,int *stride,
          int *chroma_sub_log2,uint8_t *flat_blocks,int block_size)

{
  aom_noise_strength_solver_t *solver;
  aom_noise_state_t *state;
  int *piVar1;
  byte bVar2;
  uint8_t *puVar3;
  double *pdVar4;
  double *pdVar5;
  int (*paiVar6) [2];
  byte bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  void *memblk;
  long lVar12;
  byte bVar13;
  byte bVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  ulong uVar21;
  bool bVar22;
  ushort uVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  uint8_t *puVar32;
  long lVar33;
  int iVar34;
  aom_noise_state_t *paVar35;
  ushort uVar36;
  int iVar37;
  long lVar38;
  ulong uVar39;
  char *pcVar40;
  uint uVar41;
  int iVar42;
  uint8_t *puVar43;
  uint uVar44;
  uint uVar45;
  uint8_t *puVar46;
  int x_2;
  int iVar47;
  int iVar48;
  int iVar49;
  uint uVar50;
  aom_equation_system_t *eqns;
  int j_1;
  uint8_t *puVar51;
  bool bVar52;
  bool bVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  size_t sStack_1c0;
  byte *local_198;
  int max_h;
  int max_w;
  byte *local_120;
  long local_f8;
  byte local_a0 [8];
  aom_noise_state_t *local_98;
  long local_90;
  int *local_88;
  ulong local_80;
  aom_noise_strength_solver_t *local_78;
  ulong local_70;
  long local_68;
  ulong local_60;
  ulong local_58;
  aom_noise_state_t *local_50;
  byte *local_48;
  uint8_t *local_40;
  ulong local_38;
  
  uVar17 = (long)(block_size + w + -1) / (long)block_size;
  uVar26 = (long)(block_size + h + -1) / (long)block_size;
  local_88 = stride;
  if (block_size < 2) {
    fprintf(_stderr,"block_size = %d must be > 1\n",(ulong)(uint)block_size);
  }
  else {
    uVar8 = (noise_model->params).lag * 2;
    if ((int)uVar8 < block_size) {
      local_48 = (byte *)(chroma_sub_log2 + 1);
      eqns = &noise_model->latest_state[0].eqns;
      lVar31 = 3;
      local_98 = (aom_noise_state_t *)eqns;
      while (bVar52 = lVar31 != 0, lVar31 = lVar31 + -1, bVar52) {
        equation_system_clear(eqns);
        *(undefined4 *)&eqns[3].A = 0;
        equation_system_clear(eqns + 1);
        *(undefined4 *)((long)&eqns[2].x + 4) = 0;
        *(undefined8 *)&eqns[2].n = 0;
        eqns = (aom_equation_system_t *)&eqns[3].x;
      }
      iVar9 = (int)uVar26;
      iVar11 = (int)uVar17;
      uVar8 = iVar9 * iVar11;
      uVar15 = 0;
      uVar28 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar28 = uVar15;
      }
      uVar8 = 0;
      for (; uVar28 != uVar15; uVar15 = uVar15 + 1) {
        uVar8 = (uVar8 + 1) - (uint)(flat_blocks[uVar15] == '\0');
      }
      if (uVar8 < 2) {
        fwrite("Not enough flat blocks to update noise estimate\n",0x30,1,_stderr);
        return '\x02';
      }
      lVar31 = (long)iVar11;
      local_58 = uVar17 & 0xffffffff;
      if (iVar11 < 1) {
        local_58 = 0;
      }
      local_80 = uVar26 & 0xffffffff;
      if (iVar9 < 1) {
        local_80 = 0;
      }
      local_78 = &noise_model->latest_state[0].strength_solver;
      local_50 = noise_model->combined_state;
      bVar52 = false;
      for (lVar33 = 0; paVar35 = local_98, lVar33 != 3; lVar33 = lVar33 + 1) {
        local_a0[4] = 0;
        local_a0[5] = 0;
        local_a0[6] = 0;
        local_a0[7] = 0;
        local_a0[0] = 0;
        local_a0[1] = 0;
        local_a0[2] = 0;
        local_a0[3] = 0;
        if (lVar33 == 0) {
          puVar46 = (uint8_t *)0x0;
          local_198 = local_a0;
          local_120 = local_a0 + 4;
          puVar51 = (uint8_t *)0x0;
        }
        else {
          puVar46 = *data;
          puVar51 = *denoised;
          local_198 = local_48;
          local_120 = (byte *)chroma_sub_log2;
        }
        puVar3 = data[lVar33];
        if ((puVar3 == (uint8_t *)0x0) || (puVar32 = denoised[lVar33], puVar32 == (uint8_t *)0x0))
        break;
        iVar9 = local_88[lVar33];
        iVar11 = *local_88;
        local_70 = (ulong)(uint)(noise_model->params).lag;
        iVar37 = (noise_model->params).bit_depth;
        uVar8 = noise_model->n;
        lVar16 = (long)(int)uVar8;
        pdVar4 = local_98[lVar33].eqns.A;
        pdVar5 = local_98[lVar33].eqns.b;
        memblk = aom_malloc(lVar16 * 8 + 8);
        if (memblk == (void *)0x0) {
          fprintf(_stderr,"Unable to allocate buffer of size %d\n",lVar16 + 1);
          pcVar40 = "Adding block observation failed\n";
          sStack_1c0 = 0x20;
          goto LAB_00257ae1;
        }
        local_68 = (long)(int)local_70;
        paVar35 = paVar35 + lVar33;
        uVar45 = (paVar35->eqns).n;
        dVar54 = (double)~(-1 << ((byte)iVar37 & 0x1f));
        uVar17 = 0;
        if (0 < (int)uVar8) {
          uVar17 = (ulong)uVar8;
        }
        bVar22 = puVar51 != (uint8_t *)0x0 && puVar46 != (uint8_t *)0x0;
        dVar54 = dVar54 * dVar54;
        uVar26 = 0;
        if (0 < (int)uVar45) {
          uVar26 = (ulong)uVar45;
        }
        uVar28 = 0;
        while (uVar15 = uVar28, uVar15 != local_80) {
          bVar13 = *local_198;
          lVar27 = uVar15 * lVar31;
          local_40 = flat_blocks + (uVar15 - 1) * lVar31;
          uVar28 = 0;
          while (uVar28 != local_58) {
            uVar8 = (uint)block_size >> ((byte)*(undefined4 *)local_120 & 0x1f);
            if (flat_blocks[uVar28 + lVar27] == '\0') {
              uVar28 = uVar28 + 1;
            }
            else {
              lVar30 = local_68;
              if ((uVar15 != 0) && (local_40[uVar28] != '\0')) {
                lVar30 = 0;
              }
              local_f8 = local_68;
              if ((uVar28 != 0) && (flat_blocks[uVar28 + lVar27 + -1] != '\0')) {
                local_f8 = 0;
              }
              uVar41 = (uint)block_size >> (*local_198 & 0x1f);
              local_60._0_4_ = (int)uVar15;
              uVar44 = (h >> (*local_198 & 0x1f)) - uVar41 * (int)local_60;
              if ((int)uVar41 <= (int)uVar44) {
                uVar44 = uVar41;
              }
              local_38 = uVar28 + 1;
              iVar37 = (int)local_70;
              if (((long)local_38 < lVar31) &&
                 (iVar37 = 0, flat_blocks[uVar28 + lVar27 + 1] == '\0')) {
                iVar37 = (int)local_70;
              }
              iVar24 = (int)uVar28 * uVar8;
              iVar42 = (w >> ((byte)*(undefined4 *)local_120 & 0x1f)) - ((int)local_70 + iVar24);
              iVar37 = uVar8 - iVar37;
              if (iVar42 < iVar37) {
                iVar37 = iVar42;
              }
              for (; uVar28 = local_38, lVar30 < (int)uVar44; lVar30 = lVar30 + 1) {
                lVar12 = lVar30 + ((uint)block_size >> (bVar13 & 0x1f)) * uVar15;
                lVar18 = lVar12 * iVar9;
                for (lVar29 = local_f8; lVar29 < iVar37; lVar29 = lVar29 + 1) {
                  lVar19 = lVar29 + iVar24;
                  paiVar6 = noise_model->coords;
                  iVar42 = (int)lVar19;
                  iVar34 = (int)lVar12;
                  if ((noise_model->params).use_highbd == 0) {
                    for (uVar28 = 0; uVar17 != uVar28; uVar28 = uVar28 + 1) {
                      iVar48 = (paiVar6[uVar28][1] + iVar34) * iVar9 + paiVar6[uVar28][0] + iVar42;
                      *(double *)((long)memblk + uVar28 * 8) =
                           (double)puVar3[iVar48] - (double)puVar32[iVar48];
                    }
                    lVar19 = lVar19 + lVar18;
                    bVar14 = puVar3[lVar19];
                    bVar2 = puVar32[lVar19];
                    if (bVar22) {
                      bVar7 = *local_198 & 0x1f;
                      iVar47 = 0;
                      iVar48 = 1 << bVar7;
                      if (1 << bVar7 < 1) {
                        iVar48 = iVar47;
                      }
                      iVar34 = (iVar34 << (*local_198 & 0x1f)) * iVar11;
                      dVar56 = 0.0;
                      dVar57 = 0.0;
                      for (iVar49 = 0; iVar49 != iVar48; iVar49 = iVar49 + 1) {
                        bVar7 = *local_120 & 0x1f;
                        uVar8 = 1 << bVar7;
                        if (1 << bVar7 < 1) {
                          uVar8 = 0;
                        }
                        uVar28 = (ulong)uVar8;
                        iVar25 = (iVar42 << (*local_120 & 0x1f)) + iVar34;
                        while (bVar53 = uVar28 != 0, uVar28 = uVar28 - 1, bVar53) {
                          dVar57 = dVar57 + (double)puVar46[iVar25];
                          dVar56 = dVar56 + (double)puVar51[iVar25];
                          iVar25 = iVar25 + 1;
                        }
                        iVar47 = uVar8 + iVar47;
                        iVar34 = iVar34 + iVar11;
                      }
                      *(double *)((long)memblk + lVar16 * 8) = (dVar57 - dVar56) / (double)iVar47;
                    }
                    uVar23 = (ushort)bVar2;
                    uVar36 = (ushort)bVar14;
                  }
                  else {
                    for (uVar28 = 0; uVar17 != uVar28; uVar28 = uVar28 + 1) {
                      lVar38 = (long)((paiVar6[uVar28][1] + iVar34) * iVar9 +
                                     paiVar6[uVar28][0] + iVar42);
                      *(double *)((long)memblk + uVar28 * 8) =
                           (double)*(ushort *)(puVar3 + lVar38 * 2) -
                           (double)*(ushort *)(puVar32 + lVar38 * 2);
                    }
                    lVar19 = lVar19 + lVar18;
                    uVar36 = *(ushort *)(puVar3 + lVar19 * 2);
                    uVar23 = *(ushort *)(puVar32 + lVar19 * 2);
                    if (bVar22) {
                      bVar14 = *local_198 & 0x1f;
                      iVar47 = 0;
                      iVar48 = 1 << bVar14;
                      if (1 << bVar14 < 1) {
                        iVar48 = 0;
                      }
                      iVar34 = (iVar34 << (*local_198 & 0x1f)) * iVar11;
                      dVar56 = 0.0;
                      dVar57 = 0.0;
                      for (iVar49 = 0; iVar49 != iVar48; iVar49 = iVar49 + 1) {
                        bVar14 = *local_120 & 0x1f;
                        uVar8 = 1 << bVar14;
                        if (1 << bVar14 < 1) {
                          uVar8 = 0;
                        }
                        uVar28 = (ulong)uVar8;
                        iVar25 = (iVar42 << (*local_120 & 0x1f)) + iVar34;
                        while (bVar53 = uVar28 != 0, uVar28 = uVar28 - 1, bVar53) {
                          dVar56 = dVar56 + (double)*(ushort *)(puVar51 + (long)iVar25 * 2);
                          dVar57 = dVar57 + (double)*(ushort *)(puVar46 + (long)iVar25 * 2);
                          iVar25 = iVar25 + 1;
                        }
                        iVar47 = uVar8 + iVar47;
                        iVar34 = iVar34 + iVar11;
                      }
                      *(double *)((long)memblk + lVar16 * 8) = (dVar57 - dVar56) / (double)iVar47;
                    }
                  }
                  pdVar20 = pdVar4;
                  for (uVar28 = 0; uVar28 != uVar26; uVar28 = uVar28 + 1) {
                    for (uVar39 = 0; dVar56 = *(double *)((long)memblk + uVar28 * 8),
                        uVar45 != uVar39; uVar39 = uVar39 + 1) {
                      pdVar20[uVar39] =
                           (dVar56 * *(double *)((long)memblk + uVar39 * 8)) / dVar54 +
                           pdVar20[uVar39];
                    }
                    pdVar5[uVar28] =
                         (dVar56 * ((double)uVar36 - (double)uVar23)) / dVar54 + pdVar5[uVar28];
                    pdVar20 = pdVar20 + (int)uVar45;
                  }
                  paVar35->num_observations = paVar35->num_observations + 1;
                }
              }
            }
          }
          local_60 = uVar15;
          uVar28 = uVar15 + 1;
        }
        local_90 = lVar33 * 0x70;
        aom_free(memblk);
        iVar9 = ar_equation_system_solve(paVar35,(uint)(lVar33 != 0));
        if (iVar9 == 0) {
          if (lVar33 == 0) {
            pcVar40 = "Solving latest noise equation system failed %d!\n";
            goto LAB_00257b02;
          }
          set_chroma_coefficient_fallback_soln(&paVar35->eqns);
        }
        pdVar4 = (paVar35->eqns).x;
        puVar51 = data[lVar33];
        puVar3 = denoised[lVar33];
        iVar11 = local_88[lVar33];
        lVar16 = (long)iVar11;
        iVar9 = noise_model->n;
        dVar54 = noise_model->latest_state[0].ar_gain;
        dVar56 = paVar35->ar_gain;
        puVar32 = puVar51;
        if (puVar46 != (uint8_t *)0x0) {
          iVar11 = *local_88;
          puVar32 = puVar46;
        }
        solver = &paVar35->strength_solver;
        lVar27 = (long)iVar11;
        for (uVar17 = 0; uVar17 != local_80; uVar17 = uVar17 + 1) {
          uVar8 = (uint)block_size >> (*local_198 & 0x1f);
          iVar24 = (int)uVar17;
          iVar37 = uVar8 * iVar24;
          lVar30 = (int)(uVar8 * iVar24) * lVar16;
          iVar11 = 0;
          for (uVar26 = 0; uVar26 != local_58; uVar26 = uVar26 + 1) {
            bVar13 = (byte)*(undefined4 *)local_120;
            uVar8 = (uint)block_size >> (bVar13 & 0x1f);
            if (flat_blocks[uVar26 + uVar17 * lVar31] != '\0') {
              iVar42 = (int)uVar26;
              bVar14 = (byte)*(undefined4 *)local_198;
              iVar34 = h >> (bVar14 & 0x1f);
              uVar44 = (uint)block_size >> (bVar14 & 0x1f);
              uVar45 = iVar34 - uVar44 * iVar24;
              if ((int)uVar44 <= (int)uVar45) {
                uVar45 = uVar44;
              }
              iVar48 = w >> (bVar13 & 0x1f);
              uVar41 = iVar48 - uVar8 * iVar42;
              if ((int)uVar8 <= (int)uVar41) {
                uVar41 = uVar8;
              }
              if (block_size < (int)(uVar45 * uVar41)) {
                bVar2 = bVar13 & 0x1f;
                iVar49 = uVar8 * iVar42 << bVar2;
                iVar47 = iVar37 << (bVar14 & 0x1f);
                uVar45 = h - iVar47;
                if (block_size <= h - iVar47) {
                  uVar45 = block_size;
                }
                uVar10 = w - iVar49;
                if (block_size <= w - iVar49) {
                  uVar10 = block_size;
                }
                uVar28 = 0;
                if (0 < (int)uVar10) {
                  uVar28 = (ulong)uVar10;
                }
                uVar15 = 0;
                if (0 < (int)uVar45) {
                  uVar15 = (ulong)uVar45;
                }
                iVar25 = (noise_model->params).use_highbd;
                if (iVar25 == 0) {
                  puVar46 = puVar32 + (long)iVar49 + iVar47 * lVar27;
                  dVar57 = 0.0;
                  for (uVar39 = (ulong)(uint)(0 << bVar2); uVar39 != uVar15; uVar39 = uVar39 + 1) {
                    for (uVar21 = 0; uVar28 != uVar21; uVar21 = uVar21 + 1) {
                      dVar57 = dVar57 + (double)puVar46[uVar21];
                    }
                    puVar46 = puVar46 + lVar27;
                  }
                }
                else {
                  puVar46 = puVar32 + (long)iVar47 * lVar27 * 2 + (long)iVar49 * 2;
                  dVar57 = 0.0;
                  for (uVar39 = (ulong)(uint)(0 << bVar2); uVar39 != uVar15; uVar39 = uVar39 + 1) {
                    for (uVar21 = 0; uVar28 != uVar21; uVar21 = uVar21 + 1) {
                      dVar57 = dVar57 + (double)*(ushort *)(puVar46 + uVar21 * 2);
                    }
                    puVar46 = puVar46 + lVar27 * 2;
                  }
                }
                uVar50 = iVar34 - iVar37;
                if ((int)uVar44 <= (int)uVar50) {
                  uVar50 = uVar44;
                }
                uVar28 = 0;
                if (0 < (int)uVar50) {
                  uVar28 = (ulong)uVar50;
                }
                if (iVar25 == 0) {
                  puVar46 = puVar3 + (int)(uVar8 * iVar42) + lVar30;
                  puVar43 = puVar51 + (int)(uVar8 * iVar42) + lVar30;
                  uVar44 = iVar48 + uVar8 * iVar11;
                  if ((int)uVar8 < (int)uVar44) {
                    uVar44 = uVar8;
                  }
                  if ((int)uVar44 < 1) {
                    uVar44 = 0;
                  }
                  dVar59 = 0.0;
                  dVar60 = 0.0;
                  for (uVar15 = (ulong)(0 >> (bVar13 & 0x1f)); uVar15 != uVar28; uVar15 = uVar15 + 1
                      ) {
                    for (uVar39 = 0; uVar44 != uVar39; uVar39 = uVar39 + 1) {
                      dVar58 = (double)puVar43[uVar39] - (double)puVar46[uVar39];
                      dVar59 = dVar59 + dVar58;
                      dVar60 = dVar60 + dVar58 * dVar58;
                    }
                    puVar46 = puVar46 + lVar16;
                    puVar43 = puVar43 + lVar16;
                  }
                }
                else {
                  lVar12 = (int)(uVar8 * iVar42) + lVar30;
                  uVar44 = iVar48 + uVar8 * iVar11;
                  if ((int)uVar8 < (int)uVar44) {
                    uVar44 = uVar8;
                  }
                  uVar15 = (ulong)uVar44;
                  puVar46 = puVar3 + lVar12 * 2;
                  if ((int)uVar44 < 1) {
                    uVar15 = 0;
                  }
                  puVar43 = puVar51 + lVar12 * 2;
                  dVar59 = 0.0;
                  dVar60 = 0.0;
                  for (uVar39 = 0; uVar39 != uVar28; uVar39 = uVar39 + 1) {
                    for (uVar21 = 0; uVar15 != uVar21; uVar21 = uVar21 + 1) {
                      dVar58 = (double)*(ushort *)(puVar43 + uVar21 * 2) -
                               (double)*(ushort *)(puVar46 + uVar21 * 2);
                      dVar59 = dVar59 + dVar58;
                      dVar60 = dVar60 + dVar58 * dVar58;
                    }
                    puVar46 = puVar46 + lVar16 * 2;
                    puVar43 = puVar43 + lVar16 * 2;
                  }
                }
                dVar57 = dVar57 / (double)(int)(uVar45 * uVar10);
                if (lVar33 == 0) {
                  dVar58 = 0.0;
                }
                else {
                  dVar58 = noise_strength_solver_get_bin_index(local_78,dVar57);
                  dVar55 = floor(dVar58);
                  iVar34 = noise_model->latest_state[0].strength_solver.num_bins;
                  iVar42 = (int)dVar55 + 1;
                  iVar48 = iVar34 + -1;
                  if (iVar42 < iVar34) {
                    iVar48 = iVar42;
                  }
                  pdVar5 = noise_model->latest_state[0].strength_solver.eqns.x;
                  dVar58 = ((1.0 - (dVar58 - (double)(int)dVar55)) * pdVar5[(int)dVar55] +
                           (dVar58 - (double)(int)dVar55) * pdVar5[iVar48]) * dVar54 * pdVar4[iVar9]
                  ;
                }
                dVar59 = dVar59 / (double)(int)(uVar50 * uVar41);
                dVar60 = dVar60 / (double)(int)(uVar50 * uVar41) - dVar59 * dVar59;
                dVar59 = dVar60 * 0.0625;
                dVar60 = dVar60 - dVar58 * dVar58;
                if (dVar59 <= dVar60) {
                  dVar59 = dVar60;
                }
                if (dVar59 < 0.0) {
                  dVar59 = sqrt(dVar59);
                }
                else {
                  dVar59 = SQRT(dVar59);
                }
                aom_noise_strength_solver_add_measurement(solver,dVar57,dVar59 / dVar56);
              }
            }
            iVar11 = iVar11 + -1;
          }
        }
        iVar9 = aom_noise_strength_solver_solve(solver);
        if (iVar9 == 0) {
          pcVar40 = "Solving latest noise strength failed!\n";
          sStack_1c0 = 0x26;
          goto LAB_00257ae1;
        }
        if ((lVar33 == 0) && (0 < noise_model->combined_state[0].strength_solver.num_equations)) {
          iVar9 = (noise_model->params).bit_depth;
          dVar54 = aom_normalized_cross_correlation
                             (noise_model->latest_state[0].eqns.x,
                              noise_model->combined_state[0].eqns.x,
                              noise_model->combined_state[0].eqns.n);
          lVar16 = local_90;
          bVar22 = true;
          if (0.9 <= dVar54) {
            iVar11 = noise_model->latest_state[0].strength_solver.num_bins;
            dVar54 = 0.0;
            lVar27 = 0;
            lVar30 = 0;
            dVar56 = 0.0;
            while( true ) {
              uVar8 = noise_model->latest_state[0].strength_solver.eqns.n;
              if ((int)uVar8 <= lVar30) break;
              uVar17 = (ulong)uVar8;
              dVar57 = 0.0;
              lVar12 = lVar27;
              while (bVar22 = uVar17 != 0, uVar17 = uVar17 - 1, bVar22) {
                dVar57 = dVar57 + *(double *)((long)(local_78->eqns).A + lVar12);
                lVar12 = lVar12 + (long)(int)uVar8 * 8;
              }
              if (dVar57 < 0.0) {
                dVar57 = sqrt(dVar57);
              }
              else {
                dVar57 = SQRT(dVar57);
              }
              dVar54 = dVar54 + ABS(noise_model->latest_state[0].strength_solver.eqns.x[lVar30] -
                                    noise_model->combined_state[0].strength_solver.eqns.x[lVar30]) *
                                dVar57;
              dVar56 = dVar56 + dVar57;
              lVar30 = lVar30 + 1;
              lVar27 = lVar27 + 8;
            }
            bVar22 = true;
            if (((1.0 / (double)iVar11) * dVar54) / dVar56 <=
                (double)(1 << ((char)iVar9 - 8U & 0x1f)) * 0.005 && !bVar52) goto LAB_00257805;
          }
        }
        else {
          lVar16 = local_90;
          bVar22 = true;
          if (!bVar52) {
LAB_00257805:
            state = (aom_noise_state_t *)((long)&(local_50->eqns).A + lVar16);
            piVar1 = (int *)((long)&local_50->num_observations + lVar16);
            *piVar1 = *piVar1 + paVar35->num_observations;
            equation_system_add((aom_equation_system_t *)state,&paVar35->eqns);
            iVar9 = ar_equation_system_solve(state,(uint)(lVar33 != 0));
            if (iVar9 == 0) {
              if (lVar33 == 0) {
                pcVar40 = "Solving combined noise equation system failed %d!\n";
LAB_00257b02:
                fprintf(_stderr,pcVar40,0);
                return '\x04';
              }
              set_chroma_coefficient_fallback_soln((aom_equation_system_t *)state);
            }
            equation_system_add(&(state->strength_solver).eqns,&solver->eqns);
            piVar1 = &(state->strength_solver).num_equations;
            *piVar1 = *piVar1 + (paVar35->strength_solver).num_equations;
            (state->strength_solver).total =
                 (paVar35->strength_solver).total + (state->strength_solver).total;
            iVar9 = aom_noise_strength_solver_solve(&state->strength_solver);
            bVar22 = false;
            if (iVar9 == 0) {
              pcVar40 = "Solving combined noise strength failed!\n";
              sStack_1c0 = 0x28;
LAB_00257ae1:
              fwrite(pcVar40,sStack_1c0,1,_stderr);
              return '\x04';
            }
          }
        }
        bVar52 = bVar22;
      }
      return bVar52 * '\x03';
    }
    fprintf(_stderr,"block_size = %d must be >= %d\n",(ulong)(uint)block_size,(ulong)(uVar8 | 1));
  }
  return '\x01';
}

Assistant:

aom_noise_status_t aom_noise_model_update(
    aom_noise_model_t *const noise_model, const uint8_t *const data[3],
    const uint8_t *const denoised[3], int w, int h, int stride[3],
    int chroma_sub_log2[2], const uint8_t *const flat_blocks, int block_size) {
  const int num_blocks_w = (w + block_size - 1) / block_size;
  const int num_blocks_h = (h + block_size - 1) / block_size;
  int y_model_different = 0;
  int num_blocks = 0;
  int i = 0, channel = 0;

  if (block_size <= 1) {
    fprintf(stderr, "block_size = %d must be > 1\n", block_size);
    return AOM_NOISE_STATUS_INVALID_ARGUMENT;
  }

  if (block_size < noise_model->params.lag * 2 + 1) {
    fprintf(stderr, "block_size = %d must be >= %d\n", block_size,
            noise_model->params.lag * 2 + 1);
    return AOM_NOISE_STATUS_INVALID_ARGUMENT;
  }

  // Clear the latest equation system
  for (i = 0; i < 3; ++i) {
    equation_system_clear(&noise_model->latest_state[i].eqns);
    noise_model->latest_state[i].num_observations = 0;
    noise_strength_solver_clear(&noise_model->latest_state[i].strength_solver);
  }

  // Check that we have enough flat blocks
  for (i = 0; i < num_blocks_h * num_blocks_w; ++i) {
    if (flat_blocks[i]) {
      num_blocks++;
    }
  }

  if (num_blocks <= 1) {
    fprintf(stderr, "Not enough flat blocks to update noise estimate\n");
    return AOM_NOISE_STATUS_INSUFFICIENT_FLAT_BLOCKS;
  }

  for (channel = 0; channel < 3; ++channel) {
    int no_subsampling[2] = { 0, 0 };
    const uint8_t *alt_data = channel > 0 ? data[0] : 0;
    const uint8_t *alt_denoised = channel > 0 ? denoised[0] : 0;
    int *sub = channel > 0 ? chroma_sub_log2 : no_subsampling;
    const int is_chroma = channel != 0;
    if (!data[channel] || !denoised[channel]) break;
    if (!add_block_observations(noise_model, channel, data[channel],
                                denoised[channel], w, h, stride[channel], sub,
                                alt_data, alt_denoised, stride[0], flat_blocks,
                                block_size, num_blocks_w, num_blocks_h)) {
      fprintf(stderr, "Adding block observation failed\n");
      return AOM_NOISE_STATUS_INTERNAL_ERROR;
    }

    if (!ar_equation_system_solve(&noise_model->latest_state[channel],
                                  is_chroma)) {
      if (is_chroma) {
        set_chroma_coefficient_fallback_soln(
            &noise_model->latest_state[channel].eqns);
      } else {
        fprintf(stderr, "Solving latest noise equation system failed %d!\n",
                channel);
        return AOM_NOISE_STATUS_INTERNAL_ERROR;
      }
    }

    add_noise_std_observations(
        noise_model, channel, noise_model->latest_state[channel].eqns.x,
        data[channel], denoised[channel], w, h, stride[channel], sub, alt_data,
        stride[0], flat_blocks, block_size, num_blocks_w, num_blocks_h);

    if (!aom_noise_strength_solver_solve(
            &noise_model->latest_state[channel].strength_solver)) {
      fprintf(stderr, "Solving latest noise strength failed!\n");
      return AOM_NOISE_STATUS_INTERNAL_ERROR;
    }

    // Check noise characteristics and return if error.
    if (channel == 0 &&
        noise_model->combined_state[channel].strength_solver.num_equations >
            0 &&
        is_noise_model_different(noise_model)) {
      y_model_different = 1;
    }

    // Don't update the combined stats if the y model is different.
    if (y_model_different) continue;

    noise_model->combined_state[channel].num_observations +=
        noise_model->latest_state[channel].num_observations;
    equation_system_add(&noise_model->combined_state[channel].eqns,
                        &noise_model->latest_state[channel].eqns);
    if (!ar_equation_system_solve(&noise_model->combined_state[channel],
                                  is_chroma)) {
      if (is_chroma) {
        set_chroma_coefficient_fallback_soln(
            &noise_model->combined_state[channel].eqns);
      } else {
        fprintf(stderr, "Solving combined noise equation system failed %d!\n",
                channel);
        return AOM_NOISE_STATUS_INTERNAL_ERROR;
      }
    }

    noise_strength_solver_add(
        &noise_model->combined_state[channel].strength_solver,
        &noise_model->latest_state[channel].strength_solver);

    if (!aom_noise_strength_solver_solve(
            &noise_model->combined_state[channel].strength_solver)) {
      fprintf(stderr, "Solving combined noise strength failed!\n");
      return AOM_NOISE_STATUS_INTERNAL_ERROR;
    }
  }

  return y_model_different ? AOM_NOISE_STATUS_DIFFERENT_NOISE_TYPE
                           : AOM_NOISE_STATUS_OK;
}